

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDec.c
# Opt level: O0

Abc_Obj_t * Lpk_ImplementFun(Lpk_Man_t *pMan,Abc_Ntk_t *pNtk,Vec_Ptr_t *vLeaves,Lpk_Fun_t *p)

{
  int Level;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar1;
  uint *pTruth_00;
  Hop_Obj_t *pHVar2;
  int local_44;
  int i;
  Abc_Obj_t *pObjNew;
  uint *pTruth;
  Lpk_Fun_t *p_local;
  Vec_Ptr_t *vLeaves_local;
  Abc_Ntk_t *pNtk_local;
  Lpk_Man_t *pMan_local;
  
  if (*(int *)&p->field_0x8 < 0) {
    pMan->nMuxes = pMan->nMuxes + 1;
  }
  else {
    pMan->nDsds = pMan->nDsds + 1;
  }
  pObj = Abc_NtkCreateNode(pNtk);
  for (local_44 = 0; local_44 < (int)(*(uint *)&p->field_0x8 >> 7 & 0x1f); local_44 = local_44 + 1)
  {
    pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(vLeaves,(int)p->pFanins[local_44]);
    pAVar1 = Abc_ObjRegular(pAVar1);
    Abc_ObjAddFanin(pObj,pAVar1);
  }
  Level = Abc_ObjLevelNew(pObj);
  Abc_ObjSetLevel(pObj,Level);
  pTruth_00 = Lpk_FunTruth(p,0);
  if ((*(uint *)&p->field_0x8 >> 7 & 0x1f) == 0) {
    pHVar2 = Hop_ManConst1((Hop_Man_t *)pNtk->pManFunc);
    pHVar2 = Hop_NotCond(pHVar2,(uint)(((*pTruth_00 & 1) != 0 ^ 0xffU) & 1));
    (pObj->field_5).pData = pHVar2;
  }
  else if ((*(uint *)&p->field_0x8 >> 7 & 0x1f) == 1) {
    pHVar2 = Hop_ManPi((Hop_Man_t *)pNtk->pManFunc,0);
    pHVar2 = Hop_NotCond(pHVar2,*pTruth_00 & 1);
    (pObj->field_5).pData = pHVar2;
  }
  else {
    pHVar2 = Kit_TruthToHop((Hop_Man_t *)pNtk->pManFunc,pTruth_00,*(uint *)&p->field_0x8 >> 7 & 0x1f
                            ,(Vec_Int_t *)0x0);
    (pObj->field_5).pData = pHVar2;
  }
  return pObj;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Implements the function.]

  Description [Returns the node implementing this function.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Obj_t * Lpk_ImplementFun( Lpk_Man_t * pMan, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLeaves, Lpk_Fun_t * p )
{
    extern Hop_Obj_t * Kit_TruthToHop( Hop_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory );
    unsigned * pTruth;
    Abc_Obj_t * pObjNew;
    int i;
    if ( p->fMark )
        pMan->nMuxes++;
    else
        pMan->nDsds++;
    // create the new node
    pObjNew = Abc_NtkCreateNode( pNtk );
    for ( i = 0; i < (int)p->nVars; i++ )
        Abc_ObjAddFanin( pObjNew, Abc_ObjRegular((Abc_Obj_t *)Vec_PtrEntry(vLeaves, p->pFanins[i])) );
    Abc_ObjSetLevel( pObjNew, Abc_ObjLevelNew(pObjNew) );
    // assign the node's function
    pTruth = Lpk_FunTruth(p, 0);
    if ( p->nVars == 0 )
    {
        pObjNew->pData = Hop_NotCond( Hop_ManConst1((Hop_Man_t *)pNtk->pManFunc), !(pTruth[0] & 1) );
        return pObjNew;
    }
    if ( p->nVars == 1 )
    {
        pObjNew->pData = Hop_NotCond( Hop_ManPi((Hop_Man_t *)pNtk->pManFunc, 0), (pTruth[0] & 1) );
        return pObjNew;
    }
    // create the logic function
    pObjNew->pData = Kit_TruthToHop( (Hop_Man_t *)pNtk->pManFunc, pTruth, p->nVars, NULL );
    return pObjNew;
}